

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Empty::MergeFrom(Empty *this,Empty *from)

{
  void *pvVar1;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/empty.pb.cc"
               ,0xd2);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

void Empty::MergeFrom(const Empty& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Empty)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

}